

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void SharpYUVFilterRow_SSE2(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  short *psVar1;
  short *psVar2;
  uint16_t *puVar3;
  short *psVar4;
  short *psVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint16_t uVar13;
  uint uVar14;
  int iVar15;
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar17 [16];
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  short sVar41;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  
  uVar11 = 0;
  if (7 < len) {
    uVar10 = 0;
    do {
      psVar1 = A + uVar10;
      psVar4 = A + uVar10 + 1;
      psVar2 = B + uVar10;
      psVar5 = B + uVar10 + 1;
      sVar41 = *psVar5 + *psVar1;
      sVar45 = psVar5[1] + psVar1[1];
      sVar46 = psVar5[2] + psVar1[2];
      sVar47 = psVar5[3] + psVar1[3];
      sVar48 = psVar5[4] + psVar1[4];
      sVar49 = psVar5[5] + psVar1[5];
      sVar50 = psVar5[6] + psVar1[6];
      sVar51 = psVar5[7] + psVar1[7];
      sVar16 = *psVar2 + *psVar4;
      sVar18 = psVar2[1] + psVar4[1];
      sVar19 = psVar2[2] + psVar4[2];
      sVar20 = psVar2[3] + psVar4[3];
      sVar21 = psVar2[4] + psVar4[4];
      sVar22 = psVar2[5] + psVar4[5];
      sVar23 = psVar2[6] + psVar4[6];
      sVar24 = psVar2[7] + psVar4[7];
      sVar52 = sVar16 + sVar41 + 8;
      sVar53 = sVar18 + sVar45 + 8;
      sVar54 = sVar19 + sVar46 + 8;
      sVar55 = sVar20 + sVar47 + 8;
      sVar56 = sVar21 + sVar48 + 8;
      sVar57 = sVar22 + sVar49 + 8;
      sVar58 = sVar23 + sVar50 + 8;
      sVar59 = sVar24 + sVar51 + 8;
      auVar42._0_2_ = sVar41 * 2 + sVar52;
      auVar42._2_2_ = sVar45 * 2 + sVar53;
      auVar42._4_2_ = sVar46 * 2 + sVar54;
      auVar42._6_2_ = sVar47 * 2 + sVar55;
      auVar42._8_2_ = sVar48 * 2 + sVar56;
      auVar42._10_2_ = sVar49 * 2 + sVar57;
      auVar42._12_2_ = sVar50 * 2 + sVar58;
      auVar42._14_2_ = sVar51 * 2 + sVar59;
      auVar42 = psraw(auVar42,3);
      auVar17._0_2_ = sVar16 * 2 + sVar52;
      auVar17._2_2_ = sVar18 * 2 + sVar53;
      auVar17._4_2_ = sVar19 * 2 + sVar54;
      auVar17._6_2_ = sVar20 * 2 + sVar55;
      auVar17._8_2_ = sVar21 * 2 + sVar56;
      auVar17._10_2_ = sVar22 * 2 + sVar57;
      auVar17._12_2_ = sVar23 * 2 + sVar58;
      auVar17._14_2_ = sVar24 * 2 + sVar59;
      auVar17 = psraw(auVar17,3);
      auVar44._0_2_ = auVar17._0_2_ + *psVar1;
      auVar44._2_2_ = auVar17._2_2_ + psVar1[1];
      auVar44._4_2_ = auVar17._4_2_ + psVar1[2];
      auVar44._6_2_ = auVar17._6_2_ + psVar1[3];
      auVar44._8_2_ = auVar17._8_2_ + psVar1[4];
      auVar44._10_2_ = auVar17._10_2_ + psVar1[5];
      auVar44._12_2_ = auVar17._12_2_ + psVar1[6];
      auVar44._14_2_ = auVar17._14_2_ + psVar1[7];
      auVar43._0_2_ = auVar42._0_2_ + *psVar4;
      auVar43._2_2_ = auVar42._2_2_ + psVar4[1];
      auVar43._4_2_ = auVar42._4_2_ + psVar4[2];
      auVar43._6_2_ = auVar42._6_2_ + psVar4[3];
      auVar43._8_2_ = auVar42._8_2_ + psVar4[4];
      auVar43._10_2_ = auVar42._10_2_ + psVar4[5];
      auVar43._12_2_ = auVar42._12_2_ + psVar4[6];
      auVar43._14_2_ = auVar42._14_2_ + psVar4[7];
      auVar17 = psraw(auVar44,1);
      auVar44 = psraw(auVar43,1);
      puVar3 = best_y + uVar10 * 2;
      sVar41 = *puVar3 + auVar17._0_2_;
      sVar45 = puVar3[1] + auVar44._0_2_;
      sVar46 = puVar3[2] + auVar17._2_2_;
      sVar47 = puVar3[3] + auVar44._2_2_;
      sVar48 = puVar3[4] + auVar17._4_2_;
      sVar49 = puVar3[5] + auVar44._4_2_;
      sVar50 = puVar3[6] + auVar17._6_2_;
      sVar51 = puVar3[7] + auVar44._6_2_;
      puVar3 = best_y + uVar10 * 2 + 8;
      sVar16 = *puVar3 + auVar17._8_2_;
      sVar18 = puVar3[1] + auVar44._8_2_;
      sVar19 = puVar3[2] + auVar17._10_2_;
      sVar20 = puVar3[3] + auVar44._10_2_;
      sVar21 = puVar3[4] + auVar17._12_2_;
      sVar22 = puVar3[5] + auVar44._12_2_;
      sVar23 = puVar3[6] + auVar17._14_2_;
      sVar24 = puVar3[7] + auVar44._14_2_;
      uVar33 = (ushort)(0x3ff < sVar41) * 0x3ff | (ushort)(0x3ff >= sVar41) * sVar41;
      uVar34 = (ushort)(0x3ff < sVar45) * 0x3ff | (ushort)(0x3ff >= sVar45) * sVar45;
      uVar35 = (ushort)(0x3ff < sVar46) * 0x3ff | (ushort)(0x3ff >= sVar46) * sVar46;
      uVar36 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
      uVar37 = (ushort)(0x3ff < sVar48) * 0x3ff | (ushort)(0x3ff >= sVar48) * sVar48;
      uVar38 = (ushort)(0x3ff < sVar49) * 0x3ff | (ushort)(0x3ff >= sVar49) * sVar49;
      uVar39 = (ushort)(0x3ff < sVar50) * 0x3ff | (ushort)(0x3ff >= sVar50) * sVar50;
      uVar40 = (ushort)(0x3ff < sVar51) * 0x3ff | (ushort)(0x3ff >= sVar51) * sVar51;
      uVar25 = (ushort)(0x3ff < sVar16) * 0x3ff | (ushort)(0x3ff >= sVar16) * sVar16;
      uVar26 = (ushort)(0x3ff < sVar18) * 0x3ff | (ushort)(0x3ff >= sVar18) * sVar18;
      uVar27 = (ushort)(0x3ff < sVar19) * 0x3ff | (ushort)(0x3ff >= sVar19) * sVar19;
      uVar28 = (ushort)(0x3ff < sVar20) * 0x3ff | (ushort)(0x3ff >= sVar20) * sVar20;
      uVar29 = (ushort)(0x3ff < sVar21) * 0x3ff | (ushort)(0x3ff >= sVar21) * sVar21;
      uVar30 = (ushort)(0x3ff < sVar22) * 0x3ff | (ushort)(0x3ff >= sVar22) * sVar22;
      uVar31 = (ushort)(0x3ff < sVar23) * 0x3ff | (ushort)(0x3ff >= sVar23) * sVar23;
      uVar32 = (ushort)(0x3ff < sVar24) * 0x3ff | (ushort)(0x3ff >= sVar24) * sVar24;
      puVar3 = out + uVar10 * 2;
      *puVar3 = (-1 < (short)uVar33) * uVar33;
      puVar3[1] = (-1 < (short)uVar34) * uVar34;
      puVar3[2] = (-1 < (short)uVar35) * uVar35;
      puVar3[3] = (-1 < (short)uVar36) * uVar36;
      puVar3[4] = (-1 < (short)uVar37) * uVar37;
      puVar3[5] = (-1 < (short)uVar38) * uVar38;
      puVar3[6] = (-1 < (short)uVar39) * uVar39;
      puVar3[7] = (-1 < (short)uVar40) * uVar40;
      puVar3 = out + uVar10 * 2 + 8;
      *puVar3 = (-1 < (short)uVar25) * uVar25;
      puVar3[1] = (-1 < (short)uVar26) * uVar26;
      puVar3[2] = (-1 < (short)uVar27) * uVar27;
      puVar3[3] = (-1 < (short)uVar28) * uVar28;
      puVar3[4] = (-1 < (short)uVar29) * uVar29;
      puVar3[5] = (-1 < (short)uVar30) * uVar30;
      puVar3[6] = (-1 < (short)uVar31) * uVar31;
      puVar3[7] = (-1 < (short)uVar32) * uVar32;
      uVar11 = uVar10 + 8;
      uVar9 = uVar10 + 0x10;
      uVar10 = uVar11;
    } while (uVar9 <= (uint)len);
  }
  if ((int)uVar11 < len) {
    uVar11 = uVar11 & 0xffffffff;
    lVar12 = 0;
    do {
      iVar6 = (int)B[uVar11 + lVar12 + 1] + (int)A[uVar11 + lVar12];
      sVar16 = A[uVar11 + lVar12 + 1];
      iVar15 = (int)B[uVar11 + lVar12] + (int)sVar16;
      iVar7 = iVar6 + iVar15 + 8;
      uVar8 = (uint)best_y[uVar11 * 2 + lVar12 * 2] +
              (A[uVar11 + lVar12] * 8 + iVar15 * 2 + iVar7 >> 4);
      uVar14 = 0x3ff;
      if (uVar8 < 0x3ff) {
        uVar14 = uVar8;
      }
      uVar13 = (uint16_t)uVar14;
      if ((int)uVar8 < 0) {
        uVar13 = 0;
      }
      out[uVar11 * 2 + lVar12 * 2] = uVar13;
      uVar8 = (uint)best_y[uVar11 * 2 + lVar12 * 2 + 1] + (iVar6 * 2 + sVar16 * 8 + iVar7 >> 4);
      uVar14 = 0x3ff;
      if (uVar8 < 0x3ff) {
        uVar14 = uVar8;
      }
      uVar13 = (uint16_t)uVar14;
      if ((int)uVar8 < 0) {
        uVar13 = 0;
      }
      out[uVar11 * 2 + lVar12 * 2 + 1] = uVar13;
      lVar12 = lVar12 + 1;
    } while ((uint)len - uVar11 != lVar12);
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_SSE2(const int16_t* A, const int16_t* B, int len,
                                   const uint16_t* best_y, uint16_t* out) {
  int i;
  const __m128i kCst8 = _mm_set1_epi16(8);
  const __m128i max = _mm_set1_epi16(MAX_Y);
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(A + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(A + i + 1));
    const __m128i b0 = _mm_loadu_si128((const __m128i*)(B + i + 0));
    const __m128i b1 = _mm_loadu_si128((const __m128i*)(B + i + 1));
    const __m128i a0b1 = _mm_add_epi16(a0, b1);
    const __m128i a1b0 = _mm_add_epi16(a1, b0);
    const __m128i a0a1b0b1 = _mm_add_epi16(a0b1, a1b0);  // A0+A1+B0+B1
    const __m128i a0a1b0b1_8 = _mm_add_epi16(a0a1b0b1, kCst8);
    const __m128i a0b1_2 = _mm_add_epi16(a0b1, a0b1);    // 2*(A0+B1)
    const __m128i a1b0_2 = _mm_add_epi16(a1b0, a1b0);    // 2*(A1+B0)
    const __m128i c0 = _mm_srai_epi16(_mm_add_epi16(a0b1_2, a0a1b0b1_8), 3);
    const __m128i c1 = _mm_srai_epi16(_mm_add_epi16(a1b0_2, a0a1b0b1_8), 3);
    const __m128i d0 = _mm_add_epi16(c1, a0);
    const __m128i d1 = _mm_add_epi16(c0, a1);
    const __m128i e0 = _mm_srai_epi16(d0, 1);
    const __m128i e1 = _mm_srai_epi16(d1, 1);
    const __m128i f0 = _mm_unpacklo_epi16(e0, e1);
    const __m128i f1 = _mm_unpackhi_epi16(e0, e1);
    const __m128i g0 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 0));
    const __m128i g1 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 8));
    const __m128i h0 = _mm_add_epi16(g0, f0);
    const __m128i h1 = _mm_add_epi16(g1, f1);
    const __m128i i0 = _mm_max_epi16(_mm_min_epi16(h0, max), zero);
    const __m128i i1 = _mm_max_epi16(_mm_min_epi16(h1, max), zero);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 0), i0);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 8), i1);
  }
  for (; i < len; ++i) {
    //   (9 * A0 + 3 * A1 + 3 * B0 + B1 + 8) >> 4 =
    // = (8 * A0 + 2 * (A1 + B0) + (A0 + A1 + B0 + B1 + 8)) >> 4
    // We reuse the common sub-expressions.
    const int a0b1 = A[i + 0] + B[i + 1];
    const int a1b0 = A[i + 1] + B[i + 0];
    const int a0a1b0b1 = a0b1 + a1b0 + 8;
    const int v0 = (8 * A[i + 0] + 2 * a1b0 + a0a1b0b1) >> 4;
    const int v1 = (8 * A[i + 1] + 2 * a0b1 + a0a1b0b1) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}